

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O2

double __thiscall
sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *state,int hidx)

{
  double dVar1;
  double dVar2;
  pointer paVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  double dVar8;
  
  if (hidx < this->num_inadmissible_heuristic_) {
    paVar3 = (this->heuristic_weight_).
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar8 = paVar3[hidx]._M_elems[0];
    iVar4 = calculateManhattanDistance(this,state);
    dVar1 = paVar3[hidx]._M_elems[1];
    iVar5 = calculateLinearConflict(this,state);
    dVar2 = paVar3[hidx]._M_elems[2];
    iVar6 = calculateHammingDistance(this,state);
    dVar8 = (double)iVar6 * dVar2 + (double)iVar5 * dVar1 + (double)iVar4 * dVar8;
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Heuristic index out of range...!");
    std::endl<char,std::char_traits<char>>(poVar7);
    dVar8 = -1.0;
  }
  return dVar8;
}

Assistant:

double SlidingPuzzle::getInadmissibleHeuristicCost(const SlidingPuzzleStatePtr &state,
                                                   int hidx)
{
  if (hidx > num_inadmissible_heuristic_-1)
  {
    std::cerr << "Heuristic index out of range...!" << std::endl;
    return -1.0;
  }
  
  return heuristic_weight_[hidx][0]*calculateManhattanDistance(state) +
         heuristic_weight_[hidx][1]*calculateLinearConflict(state) +
         heuristic_weight_[hidx][2]*calculateHammingDistance(state);
}